

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesFabricPortGetMultiPortThroughput
          (zes_device_handle_t hDevice,uint32_t numPorts,zes_fabric_port_handle_t *phPort,
          zes_fabric_port_throughput_t **pThroughput)

{
  zes_pfnFabricPortGetMultiPortThroughput_t pfnGetMultiPortThroughput;
  ze_result_t result;
  zes_fabric_port_throughput_t **pThroughput_local;
  zes_fabric_port_handle_t *phPort_local;
  uint32_t numPorts_local;
  zes_device_handle_t hDevice_local;
  
  pfnGetMultiPortThroughput._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cd48 != (code *)0x0) {
    pfnGetMultiPortThroughput._4_4_ = (*DAT_0011cd48)(hDevice,numPorts,phPort,pThroughput);
  }
  return pfnGetMultiPortThroughput._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFabricPortGetMultiPortThroughput(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t numPorts,                              ///< [in] Number of ports enumerated in function ::zesDeviceEnumFabricPorts
        zes_fabric_port_handle_t* phPort,               ///< [in][range(0, numPorts)] array of fabric port handles provided by user
                                                        ///< to gather throughput values. 
        zes_fabric_port_throughput_t** pThroughput      ///< [out][range(0, numPorts)] array of fabric port throughput counters
                                                        ///< from multiple ports of type ::zes_fabric_port_throughput_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetMultiPortThroughput = context.zesDdiTable.FabricPort.pfnGetMultiPortThroughput;
        if( nullptr != pfnGetMultiPortThroughput )
        {
            result = pfnGetMultiPortThroughput( hDevice, numPorts, phPort, pThroughput );
        }
        else
        {
            // generic implementation
        }

        return result;
    }